

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void qt_qFindChildren_helper
               (QObject *parent,QAnyStringView name,QMetaObject *mo,QList<void_*> *list,
               FindChildOptions options)

{
  QObjectData *pQVar1;
  QObject **ppQVar2;
  long lVar3;
  QObject *obj;
  bool bVar4;
  QObject *pQVar5;
  long lVar6;
  
  pQVar1 = (parent->d_ptr).d;
  ppQVar2 = (pQVar1->children).d.ptr;
  lVar3 = (pQVar1->children).d.size;
  lVar6 = 0;
  do {
    if (lVar3 << 3 == lVar6) {
      return;
    }
    obj = *(QObject **)((long)ppQVar2 + lVar6);
    pQVar5 = QMetaObject::cast(mo,obj);
    if (pQVar5 != (QObject *)0x0) {
      if (name.field_0.m_data != (void *)0x0) {
        bVar4 = matches_objectName_non_null(obj,name);
        if (!bVar4) goto LAB_0028a504;
      }
      QList<void_*>::append(list,obj);
    }
LAB_0028a504:
    if (((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
               super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
      qt_qFindChildren_helper(obj,name,mo,list,options);
    }
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

void qt_qFindChildren_helper(const QObject *parent, QAnyStringView name,
                             const QMetaObject &mo, QList<void*> *list, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    Q_ASSERT(list);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
            list->append(obj);
        if (options & Qt::FindChildrenRecursively)
            qt_qFindChildren_helper(obj, name, mo, list, options);
    }
}